

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

char * escape_string(char *src)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  
  lVar4 = 1;
  lVar2 = 0;
  do {
    cVar3 = src[lVar4 + -1];
    if ((cVar3 == '\"') || (cVar3 == '\\')) {
      lVar2 = lVar2 + 1;
    }
    else if (cVar3 == '\0') {
      pcVar1 = (char *)(*Curl_cmalloc)(lVar4 + lVar2);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      lVar2 = 0;
      do {
        cVar3 = *src;
        if ((cVar3 == '\"') || (cVar3 == '\\')) {
          pcVar1[lVar2] = '\\';
          lVar2 = lVar2 + 1;
          cVar3 = *src;
        }
        else if (cVar3 == '\0') {
          pcVar1[lVar2] = '\0';
          return pcVar1;
        }
        pcVar1[lVar2] = cVar3;
        lVar2 = lVar2 + 1;
        src = src + 1;
      } while( true );
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static char *escape_string(const char *src)
{
  size_t bytecount = 0;
  size_t i;
  char *dst;

  for(i = 0; src[i]; i++)
    if(src[i] == '"' || src[i] == '\\')
      bytecount++;

  bytecount += i;
  dst = malloc(bytecount + 1);
  if(!dst)
    return NULL;

  for(i = 0; *src; src++) {
    if(*src == '"' || *src == '\\')
      dst[i++] = '\\';
    dst[i++] = *src;
  }

  dst[i] = '\0';
  return dst;
}